

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterNext_Reverse(Fts5Index *p,Fts5SegIter *pIter,int *pbUnused)

{
  u64 local_38;
  i64 iDelta;
  u8 *puStack_28;
  int iOff;
  u8 *a;
  int *pbUnused_local;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  a = (u8 *)pbUnused;
  pbUnused_local = (int *)pIter;
  pIter_local = (Fts5SegIter *)p;
  if (pIter->iRowidOffset < 1) {
    fts5SegIterReverseNewPage(p,pIter);
  }
  else {
    puStack_28 = pIter->pLeaf->p;
    pIter->iRowidOffset = pIter->iRowidOffset + -1;
    pIter->iLeafOffset = pIter->aRowidOffset[pIter->iRowidOffset];
    fts5SegIterLoadNPos(p,pIter);
    iDelta._4_4_ = pbUnused_local[8];
    if (pIter_local->pSeg[7].pgnoLast != 1) {
      iDelta._4_4_ = pbUnused_local[0x1c] + iDelta._4_4_;
    }
    sqlite3Fts5GetVarint(puStack_28 + iDelta._4_4_,&local_38);
    *(u64 *)(pbUnused_local + 0x1a) = *(long *)(pbUnused_local + 0x1a) - local_38;
  }
  return;
}

Assistant:

static void fts5SegIterNext_Reverse(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int *pbUnused                   /* Unused */
){
  assert( pIter->flags & FTS5_SEGITER_REVERSE );
  assert( pIter->pNextLeaf==0 );
  UNUSED_PARAM(pbUnused);

  if( pIter->iRowidOffset>0 ){
    u8 *a = pIter->pLeaf->p;
    int iOff;
    i64 iDelta;

    pIter->iRowidOffset--;
    pIter->iLeafOffset = pIter->aRowidOffset[pIter->iRowidOffset];
    fts5SegIterLoadNPos(p, pIter);
    iOff = pIter->iLeafOffset;
    if( p->pConfig->eDetail!=FTS5_DETAIL_NONE ){
      iOff += pIter->nPos;
    }
    fts5GetVarint(&a[iOff], (u64*)&iDelta);
    pIter->iRowid -= iDelta;
  }else{
    fts5SegIterReverseNewPage(p, pIter);
  }
}